

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec *
cram_huffman_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  void *__base;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int code_len;
  int ind2;
  int ind1;
  int low2;
  int low1;
  khint_t k_1;
  cram_huffman_code *codes;
  cram_codec *c;
  int k;
  int min_val;
  int max_val;
  int ntot;
  int i;
  int nvals;
  int len;
  int code;
  int *lens;
  void *pvStack_40;
  int vals_alloc;
  int *freqs;
  int *vals;
  int version_local;
  void *dat_local;
  cram_external_type option_local;
  cram_stats *st_local;
  
  freqs = (int *)0x0;
  pvStack_40 = (void *)0x0;
  lens._4_4_ = 0;
  k = 0;
  c._4_4_ = 0x7fffffff;
  st_local = (cram_stats *)malloc(0x240);
  if (st_local == (cram_stats *)0x0) {
    st_local = (cram_stats *)0x0;
  }
  else {
    st_local->freqs[0] = 3;
    ntot = 0;
    for (max_val = 0; max_val < 0x400; max_val = max_val + 1) {
      if (st->freqs[max_val] != 0) {
        if (lens._4_4_ <= ntot) {
          if (lens._4_4_ == 0) {
            local_9c = 0x400;
          }
          else {
            local_9c = lens._4_4_ << 1;
          }
          lens._4_4_ = local_9c;
          freqs = (int *)realloc(freqs,(long)local_9c << 2);
          pvStack_40 = realloc(pvStack_40,(long)local_9c << 2);
          if ((freqs == (int *)0x0) || (pvStack_40 == (void *)0x0)) {
            if (freqs != (int *)0x0) {
              free(freqs);
            }
            if (pvStack_40 != (void *)0x0) {
              free(pvStack_40);
            }
            free(st_local);
            return (cram_codec *)0x0;
          }
        }
        freqs[ntot] = max_val;
        *(int *)((long)pvStack_40 + (long)ntot * 4) = st->freqs[max_val];
        if (st->freqs[max_val] < 1) {
          __assert_fail("st->freqs[i] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                        ,0x4cb,
                        "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                       );
        }
        if (k < max_val) {
          k = max_val;
        }
        if (max_val < c._4_4_) {
          c._4_4_ = max_val;
        }
        ntot = ntot + 1;
      }
    }
    if (st->h != (kh_m_i2i_t *)0x0) {
      for (low2 = 0; low2 != st->h->n_buckets; low2 = low2 + 1) {
        if ((st->h->flags[(uint)low2 >> 4] >> (sbyte)((low2 & 0xfU) << 1) & 3) == 0) {
          if (lens._4_4_ <= ntot) {
            if (lens._4_4_ == 0) {
              local_a0 = 0x400;
            }
            else {
              local_a0 = lens._4_4_ << 1;
            }
            lens._4_4_ = local_a0;
            freqs = (int *)realloc(freqs,(long)local_a0 << 2);
            pvStack_40 = realloc(pvStack_40,(long)local_a0 << 2);
            if ((freqs == (int *)0x0) || (pvStack_40 == (void *)0x0)) {
              return (cram_codec *)0x0;
            }
          }
          freqs[ntot] = st->h->keys[(uint)low2];
          *(int *)((long)pvStack_40 + (long)ntot * 4) = st->h->vals[(uint)low2];
          if (*(int *)((long)pvStack_40 + (long)ntot * 4) < 1) {
            __assert_fail("freqs[nvals] > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                          ,0x4e0,
                          "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                         );
          }
          if (k < max_val) {
            k = max_val;
          }
          if (max_val < c._4_4_) {
            c._4_4_ = max_val;
          }
          ntot = ntot + 1;
        }
      }
    }
    if (ntot < 1) {
      __assert_fail("nvals > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                    ,0x4e8,
                    "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                   );
    }
    __ptr = realloc(pvStack_40,(long)(ntot << 1) << 2);
    __ptr_00 = calloc((long)(ntot << 1),4);
    if ((__ptr_00 == (void *)0x0) || (__ptr == (void *)0x0)) {
      st_local = (cram_stats *)0x0;
    }
    else {
      while( true ) {
        ind1 = 0x7fffffff;
        ind2 = 0x7fffffff;
        code_len = 0;
        local_94 = 0;
        for (max_val = 0; max_val < ntot; max_val = max_val + 1) {
          if (-1 < *(int *)((long)__ptr + (long)max_val * 4)) {
            if (*(int *)((long)__ptr + (long)max_val * 4) < ind1) {
              ind2 = ind1;
              local_94 = code_len;
              ind1 = *(int *)((long)__ptr + (long)max_val * 4);
              code_len = max_val;
            }
            else if (*(int *)((long)__ptr + (long)max_val * 4) < ind2) {
              ind2 = *(int *)((long)__ptr + (long)max_val * 4);
              local_94 = max_val;
            }
          }
        }
        if (ind2 == 0x7fffffff) break;
        *(int *)((long)__ptr + (long)ntot * 4) = ind1 + ind2;
        *(int *)((long)__ptr_00 + (long)code_len * 4) = ntot;
        *(int *)((long)__ptr_00 + (long)local_94 * 4) = ntot;
        *(int *)((long)__ptr + (long)code_len * 4) = -*(int *)((long)__ptr + (long)code_len * 4);
        *(int *)((long)__ptr + (long)local_94 * 4) = -*(int *)((long)__ptr + (long)local_94 * 4);
        ntot = ntot + 1;
      }
      iVar1 = ntot / 2 + 1;
      for (max_val = 0; max_val < iVar1; max_val = max_val + 1) {
        local_98 = 0;
        for (c._0_4_ = *(int *)((long)__ptr_00 + (long)max_val * 4); (int)c != 0;
            c._0_4_ = *(int *)((long)__ptr_00 + (long)(int)c * 4)) {
          local_98 = local_98 + 1;
        }
        *(int *)((long)__ptr_00 + (long)max_val * 4) = local_98;
        *(int *)((long)__ptr + (long)max_val * 4) = -*(int *)((long)__ptr + (long)max_val * 4);
      }
      __base = malloc((long)iVar1 << 4);
      if (__base == (void *)0x0) {
        st_local = (cram_stats *)0x0;
      }
      else {
        for (max_val = 0; max_val < iVar1; max_val = max_val + 1) {
          *(int *)((long)__base + (long)max_val * 0x10) = freqs[max_val];
          *(undefined4 *)((long)__base + (long)max_val * 0x10 + 0xc) =
               *(undefined4 *)((long)__ptr_00 + (long)max_val * 4);
        }
        qsort(__base,(long)iVar1,0x10,code_sort);
        nvals = 0;
        i = *(int *)((long)__base + 0xc);
        for (max_val = 0; max_val < iVar1; max_val = max_val + 1) {
          for (; i != *(int *)((long)__base + (long)max_val * 0x10 + 0xc); i = i + 1) {
            nvals = nvals << 1;
          }
          *(int *)((long)__base + (long)max_val * 0x10 + 8) = nvals;
          if ((-2 < *(int *)((long)__base + (long)max_val * 0x10)) &&
             (*(int *)((long)__base + (long)max_val * 0x10) < 0x80)) {
            st_local->freqs[(long)(*(int *)((long)__base + (long)max_val * 0x10) + 1) + 0xf] =
                 max_val;
          }
          nvals = nvals + 1;
        }
        free(__ptr_00);
        free(freqs);
        free(__ptr);
        *(void **)(st_local->freqs + 0xc) = __base;
        st_local->freqs[0xe] = iVar1;
        *(code **)(st_local->freqs + 4) = cram_huffman_encode_free;
        if ((option == E_BYTE) || (option == E_BYTE_ARRAY)) {
          if (*(int *)(*(long *)(st_local->freqs + 0xc) + 0xc) == 0) {
            *(code **)(st_local->freqs + 8) = cram_huffman_encode_char0;
          }
          else {
            *(code **)(st_local->freqs + 8) = cram_huffman_encode_char;
          }
        }
        else if (*(int *)(*(long *)(st_local->freqs + 0xc) + 0xc) == 0) {
          *(code **)(st_local->freqs + 8) = cram_huffman_encode_int0;
        }
        else {
          *(code **)(st_local->freqs + 8) = cram_huffman_encode_int;
        }
        *(code **)(st_local->freqs + 10) = cram_huffman_encode_store;
      }
    }
  }
  return (cram_codec *)st_local;
}

Assistant:

cram_codec *cram_huffman_encode_init(cram_stats *st,
				     enum cram_external_type option,
				     void *dat,
				     int version) {
    int *vals = NULL, *freqs = NULL, vals_alloc = 0, *lens, code, len;
    int nvals, i, ntot = 0, max_val = 0, min_val = INT_MAX, k;
    cram_codec *c;
    cram_huffman_code *codes;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_HUFFMAN;

    /* Count number of unique symbols */
    for (nvals = i = 0; i < MAX_STAT_VAL; i++) {
	if (!st->freqs[i])
	    continue;
	if (nvals >= vals_alloc) {
	    vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
	    vals  = realloc(vals,  vals_alloc * sizeof(int));
	    freqs = realloc(freqs, vals_alloc * sizeof(int));
	    if (!vals || !freqs) {
		if (vals)  free(vals);
		if (freqs) free(freqs);
		free(c);
		return NULL;
	    }
	}
	vals[nvals] = i;
	freqs[nvals] = st->freqs[i];
	assert(st->freqs[i] > 0);
	ntot += freqs[nvals];
	if (max_val < i) max_val = i;
	if (min_val > i) min_val = i;
	nvals++;
    }
    if (st->h) {
	khint_t k;

	for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
	    if (!kh_exist(st->h, k))
		continue;
	    if (nvals >= vals_alloc) {
		vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
		vals  = realloc(vals,  vals_alloc * sizeof(int));
		freqs = realloc(freqs, vals_alloc * sizeof(int));
		if (!vals || !freqs)
		    return NULL;
	    }
	    vals[nvals]= kh_key(st->h, k);
	    freqs[nvals] = kh_val(st->h, k);
	    assert(freqs[nvals] > 0);
	    ntot += freqs[nvals];
	    if (max_val < i) max_val = i;
	    if (min_val > i) min_val = i;
	    nvals++;
	}
    }

    assert(nvals > 0);

    freqs = realloc(freqs, 2*nvals*sizeof(*freqs));
    lens = calloc(2*nvals, sizeof(*lens));
    if (!lens || !freqs)
	return NULL;

    /* Inefficient, use pointers to form chain so we can insert and maintain
     * a sorted list? This is currently O(nvals^2) complexity.
     */
    for (;;) {
	int low1 = INT_MAX, low2 = INT_MAX;
	int ind1 = 0, ind2 = 0;
	for (i = 0; i < nvals; i++) {
	    if (freqs[i] < 0)
		continue;
	    if (low1 > freqs[i]) 
		low2 = low1, ind2 = ind1, low1 = freqs[i], ind1 = i;
	    else if (low2 > freqs[i])
		low2 = freqs[i], ind2 = i;
	}
	if (low2 == INT_MAX)
	    break;

	freqs[nvals] = low1 + low2;
	lens[ind1] = nvals;
	lens[ind2] = nvals;
	freqs[ind1] *= -1;
	freqs[ind2] *= -1;
	nvals++;
    }
    nvals = nvals/2+1;

    /* Assign lengths */
    for (i = 0; i < nvals; i++) {
	int code_len = 0;
	for (k = lens[i]; k; k = lens[k])
	    code_len++;
	lens[i] = code_len;
	freqs[i] *= -1;
	//fprintf(stderr, "%d / %d => %d\n", vals[i], freqs[i], lens[i]);
    }


    /* Sort, need in a struct */
    if (!(codes = malloc(nvals * sizeof(*codes))))
	return NULL;
    for (i = 0; i < nvals; i++) {
	codes[i].symbol = vals[i];
	codes[i].len = lens[i];
    }
    qsort(codes, nvals, sizeof(*codes), code_sort);

    /*
     * Generate canonical codes from lengths.
     * Sort by length.
     * Start with 0.
     * Every new code of same length is +1.
     * Every new code of new length is +1 then <<1 per extra length.
     *
     * /\
     * a/\
     * /\/\
     * bcd/\
     *    ef
     * 
     * a 1  0
     * b 3  4 (0+1)<<2
     * c 3  5
     * d 3  6
     * e 4  14  (6+1)<<1
     * f 5  15     
     */
    code = 0; len = codes[0].len;
    for (i = 0; i < nvals; i++) {
	while (len != codes[i].len) {
	    code<<=1;
	    len++;
	}
	codes[i].code = code++;

	if (codes[i].symbol >= -1 && codes[i].symbol < MAX_HUFF)
	    c->e_huffman.val2code[codes[i].symbol+1] = i;

	//fprintf(stderr, "sym %d, code %d, len %d\n",
	//	codes[i].symbol, codes[i].code, codes[i].len);
    }

    free(lens);
    free(vals);
    free(freqs);

    c->e_huffman.codes = codes;
    c->e_huffman.nvals = nvals;

    c->free = cram_huffman_encode_free;
    if (option == E_BYTE || option == E_BYTE_ARRAY) {
	if (c->e_huffman.codes[0].len == 0)
	    c->encode = cram_huffman_encode_char0;
	else
	    c->encode = cram_huffman_encode_char;
    } else {
	if (c->e_huffman.codes[0].len == 0)
	    c->encode = cram_huffman_encode_int0;
	else
	    c->encode = cram_huffman_encode_int;
    }
    c->store = cram_huffman_encode_store;

    return c;
}